

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewREGEX(TransformSelector *this,string *regex)

{
  int iVar1;
  TransformSelector *this_00;
  transform_error *this_01;
  allocator<char> local_49;
  string local_48;
  
  this_00 = (TransformSelector *)operator_new(600);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"REGEX",&local_49);
  anon_unknown.dwarf_44c526::TransformSelector::TransformSelector(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this_00->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorRegex_0098cc10;
  cmsys::RegularExpression::RegularExpression((RegularExpression *)(this_00 + 1),regex);
  iVar1 = (*(this_00->super_TransformSelector)._vptr_TransformSelector[3])(this_00,0);
  if ((char)iVar1 != '\0') {
    this->_vptr_TransformSelector = (_func_int **)this_00;
    return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
              )this;
  }
  this_01 = (transform_error *)__cxa_allocate_exception(0x10);
  cmStrCat<char_const(&)[64],std::__cxx11::string_const&,char_const(&)[3]>
            (&local_48,
             (char (*) [64])"sub-command TRANSFORM, selector REGEX failed to compile regex \"",regex
             ,(char (*) [3])0x6c41d8);
  transform_error::transform_error(this_01,&local_48);
  __cxa_throw(this_01,&transform_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewREGEX(
  std::string const& regex)
{
  std::unique_ptr<::TransformSelector> selector =
    cm::make_unique<TransformSelectorRegex>(regex);
  if (!selector->Validate()) {
    throw transform_error(
      cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
               "regex \"",
               regex, "\"."));
  }
  // weird construct to please all compilers
  return std::unique_ptr<cmList::TransformSelector>(selector.release());
}